

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void memory_region_init_tricore(uc_struct_conflict15 *uc,MemoryRegion_conflict *mr,uint64_t size)

{
  Int128 *pIVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint64_t a;
  uint64_t size_local;
  MemoryRegion_conflict *mr_local;
  uc_struct_conflict15 *uc_local;
  
  a = 0;
  memset(mr,0,0xa0);
  mr->uc = (uc_struct_conflict12 *)uc;
  mr->ops = &unassigned_mem_ops_tricore;
  mr->enabled = true;
  mr->destructor = memory_region_destructor_none;
  (mr->subregions).tqh_first = (MemoryRegion *)0x0;
  (mr->subregions).tqh_circ.tql_prev = (QTailQLink *)&mr->subregions;
  pIVar1 = int128_make64((Int128 *)size,a);
  *(undefined8 *)((long)&mr->size + 8) = extraout_RDX;
  *(Int128 **)&mr->size = pIVar1;
  if (size == 0xffffffffffffffff) {
    pIVar1 = int128_2_64();
    *(undefined8 *)((long)&mr->size + 8) = extraout_RDX_00;
    *(Int128 **)&mr->size = pIVar1;
  }
  return;
}

Assistant:

void memory_region_init(struct uc_struct *uc,
                        MemoryRegion *mr,
                        uint64_t size)
{
    memset(mr, 0, sizeof(*mr));
    mr->uc = uc;
    /* memory_region_initfn */
    mr->ops = &unassigned_mem_ops;
    mr->enabled = true;
    mr->destructor = memory_region_destructor_none;
    QTAILQ_INIT(&mr->subregions);

    mr->size = int128_make64(size);
    if (size == UINT64_MAX) {
        mr->size = int128_2_64();
    }
}